

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeAddWindow(ImGuiDockNode *node,ImGuiWindow *window,bool add_to_tab_bar)

{
  short sVar1;
  short sVar2;
  ushort uVar3;
  short sVar4;
  ushort uVar5;
  float fVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ImGuiTabBar *tab_bar;
  long lVar10;
  ImGuiWindow **ppIVar11;
  ushort uVar12;
  bool bVar13;
  int local_2c;
  int n;
  ImGuiContext *g;
  ImGuiWindow *pIStack_18;
  bool add_to_tab_bar_local;
  ImGuiWindow *window_local;
  ImGuiDockNode *node_local;
  
  pIStack_18 = window;
  window_local = (ImGuiWindow *)node;
  if (window->DockNode != (ImGuiDockNode *)0x0) {
    if (window->DockNode->ID == node->ID) {
      __assert_fail("window->DockNode->ID != node->ID",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                    ,0x3092,"void ImGui::DockNodeAddWindow(ImGuiDockNode *, ImGuiWindow *, bool)");
    }
    DockNodeRemoveWindow(window->DockNode,window,0);
  }
  bVar13 = true;
  if (pIStack_18->DockNode != (ImGuiDockNode *)0x0) {
    bVar13 = pIStack_18->DockNodeAsHost == (ImGuiDockNode *)0x0;
  }
  if (bVar13) {
    ImVector<ImGuiWindow_*>::push_back
              ((ImVector<ImGuiWindow_*> *)&(window_local->WindowClass).DockNodeFlagsOverrideClear,
               &stack0xffffffffffffffe8);
    window_local->Collapsed = (bool)(window_local->Collapsed & 0xfdU | 2);
    pIStack_18->DockNode = (ImGuiDockNode *)window_local;
    pIStack_18->DockId = *(ImGuiID *)&window_local->Name;
    pIStack_18->field_0x482 =
         pIStack_18->field_0x482 & 0xfe | 1 < (window_local->WindowClass).DockNodeFlagsOverrideClear
    ;
    pIStack_18->field_0x482 = pIStack_18->field_0x482 & 0xfb;
    lVar7._0_4_ = window_local->NameBufLen;
    lVar7._4_4_ = window_local->MoveId;
    if (((lVar7 == 0) && ((window_local->WindowClass).DockNodeFlagsOverrideClear == 2)) &&
       (ppIVar11 = ImVector<ImGuiWindow_*>::operator[]
                             ((ImVector<ImGuiWindow_*> *)
                              &(window_local->WindowClass).DockNodeFlagsOverrideClear,0),
       ((*ppIVar11)->WasActive & 1U) == 0)) {
      ppIVar11 = ImVector<ImGuiWindow_*>::operator[]
                           ((ImVector<ImGuiWindow_*> *)
                            &(window_local->WindowClass).DockNodeFlagsOverrideClear,0);
      (*ppIVar11)->Hidden = true;
      ppIVar11 = ImVector<ImGuiWindow_*>::operator[]
                           ((ImVector<ImGuiWindow_*> *)
                            &(window_local->WindowClass).DockNodeFlagsOverrideClear,0);
      (*ppIVar11)->HiddenFramesCanSkipItems = 1;
    }
    lVar8._0_4_ = window_local->NameBufLen;
    lVar8._4_4_ = window_local->MoveId;
    if ((lVar8 == 0) &&
       (bVar13 = ImGuiDockNode::IsFloatingNode((ImGuiDockNode *)window_local), bVar13)) {
      sVar1._0_1_ = window_local->WasActive;
      sVar1._1_1_ = window_local->WriteAccessed;
      if ((short)(sVar1 << 0xd) >> 0xd == 0) {
        uVar12._0_1_ = window_local->WasActive;
        uVar12._1_1_ = window_local->WriteAccessed;
        uVar12 = uVar12 & 0xfff8 | 2;
        window_local->WasActive = (bool)(char)uVar12;
        window_local->WriteAccessed = (bool)(char)(uVar12 >> 8);
      }
      sVar2._0_1_ = window_local->WasActive;
      sVar2._1_1_ = window_local->WriteAccessed;
      if ((short)(sVar2 << 10) >> 0xd == 0) {
        uVar3._0_1_ = window_local->WasActive;
        uVar3._1_1_ = window_local->WriteAccessed;
        uVar12 = uVar3 & 0xffc7 | 0x10;
        window_local->WasActive = (bool)(char)uVar12;
        window_local->WriteAccessed = (bool)(char)(uVar12 >> 8);
      }
      sVar4._0_1_ = window_local->WasActive;
      sVar4._1_1_ = window_local->WriteAccessed;
      if ((short)(sVar4 << 7) >> 0xd == 0) {
        uVar5._0_1_ = window_local->WasActive;
        uVar5._1_1_ = window_local->WriteAccessed;
        uVar12 = uVar5 & 0xfe3f | 0x80;
        window_local->WasActive = (bool)(char)uVar12;
        window_local->WriteAccessed = (bool)(char)(uVar12 >> 8);
      }
    }
    if (add_to_tab_bar) {
      lVar9._0_4_ = window_local->ViewportId;
      lVar9._4_4_ = (window_local->ViewportPos).x;
      if (lVar9 == 0) {
        DockNodeAddTabBar((ImGuiDockNode *)window_local);
        fVar6 = (window_local->ScrollbarSizes).y;
        *(float *)(*(long *)&window_local->ViewportId + 0x18) = fVar6;
        *(float *)(*(long *)&window_local->ViewportId + 0x14) = fVar6;
        for (local_2c = 0; local_2c < (window_local->WindowClass).DockNodeFlagsOverrideClear + -1;
            local_2c = local_2c + 1) {
          tab_bar = *(ImGuiTabBar **)&window_local->ViewportId;
          ppIVar11 = ImVector<ImGuiWindow_*>::operator[]
                               ((ImVector<ImGuiWindow_*> *)
                                &(window_local->WindowClass).DockNodeFlagsOverrideClear,local_2c);
          TabBarAddTab(tab_bar,0,*ppIVar11);
        }
      }
      TabBarAddTab(*(ImGuiTabBar **)&window_local->ViewportId,0x200000,pIStack_18);
    }
    DockNodeUpdateVisibleFlag((ImGuiDockNode *)window_local);
    lVar10._0_4_ = window_local->NameBufLen;
    lVar10._4_4_ = window_local->MoveId;
    if (lVar10 != 0) {
      UpdateWindowParentAndRootLinks
                (pIStack_18,pIStack_18->Flags | 0x1000000,*(ImGuiWindow **)&window_local->NameBufLen
                );
    }
    return;
  }
  __assert_fail("window->DockNode == __null || window->DockNodeAsHost == __null",
                "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                ,0x3095,"void ImGui::DockNodeAddWindow(ImGuiDockNode *, ImGuiWindow *, bool)");
}

Assistant:

static void ImGui::DockNodeAddWindow(ImGuiDockNode* node, ImGuiWindow* window, bool add_to_tab_bar)
{
    ImGuiContext& g = *GImGui; (void)g;
    if (window->DockNode)
    {
        // Can overwrite an existing window->DockNode (e.g. pointing to a disabled DockSpace node)
        IM_ASSERT(window->DockNode->ID != node->ID);
        DockNodeRemoveWindow(window->DockNode, window, 0);
    }
    IM_ASSERT(window->DockNode == NULL || window->DockNodeAsHost == NULL);
    IMGUI_DEBUG_LOG_DOCKING("DockNodeAddWindow node 0x%08X window '%s'\n", node->ID, window->Name);

    node->Windows.push_back(window);
    node->WantHiddenTabBarUpdate = true;
    window->DockNode = node;
    window->DockId = node->ID;
    window->DockIsActive = (node->Windows.Size > 1);
    window->DockTabWantClose = false;

    // If more than 2 windows appeared on the same frame, we'll create a new hosting DockNode from the point of the second window submission.
    // Then we need to hide the first window (after its been output) otherwise it would be visible as a standalone window for one frame.
    if (node->HostWindow == NULL && node->Windows.Size == 2 && node->Windows[0]->WasActive == false)
    {
        node->Windows[0]->Hidden = true;
        node->Windows[0]->HiddenFramesCanSkipItems = 1;
    }

    // When reactivating a node with one or two loose window, the window pos/size/viewport are authoritative over the node storage.
    // In particular it is important we init the viewport from the first window so we don't create two viewports and drop one.
    if (node->HostWindow == NULL && node->IsFloatingNode())
    {
        if (node->AuthorityForPos == ImGuiDataAuthority_Auto)
            node->AuthorityForPos = ImGuiDataAuthority_Window;
        if (node->AuthorityForSize == ImGuiDataAuthority_Auto)
            node->AuthorityForSize = ImGuiDataAuthority_Window;
        if (node->AuthorityForViewport == ImGuiDataAuthority_Auto)
            node->AuthorityForViewport = ImGuiDataAuthority_Window;
    }

    // Add to tab bar if requested
    if (add_to_tab_bar)
    {
        if (node->TabBar == NULL)
        {
            DockNodeAddTabBar(node);
            node->TabBar->SelectedTabId = node->TabBar->NextSelectedTabId = node->SelectedTabId;

            // Add existing windows
            for (int n = 0; n < node->Windows.Size - 1; n++)
                TabBarAddTab(node->TabBar, ImGuiTabItemFlags_None, node->Windows[n]);
        }
        TabBarAddTab(node->TabBar, ImGuiTabItemFlags_Unsorted, window);
    }

    DockNodeUpdateVisibleFlag(node);

    // Update this without waiting for the next time we Begin() in the window, so our host window will have the proper title bar color on its first frame.
    if (node->HostWindow)
        UpdateWindowParentAndRootLinks(window, window->Flags | ImGuiWindowFlags_ChildWindow, node->HostWindow);
}